

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

bool __thiscall Assimp::ASE::Parser::SkipToNextToken(Parser *this)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  byte bVar4;
  
  bVar4 = this->bLastWasEndLine;
  uVar3 = this->iLineNumber;
  pbVar2 = (byte *)this->filePtr;
  while( true ) {
    bVar1 = *pbVar2;
    if (((bVar1 < 0xe) && ((0x3401U >> (bVar1 & 0x1f) & 1) != 0)) && ((bVar4 & 1) == 0)) {
      uVar3 = uVar3 + 1;
      this->iLineNumber = uVar3;
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
    this->bLastWasEndLine = (bool)bVar4;
    if (bVar1 == 0) break;
    if (((bVar1 == 0x2a) || (bVar1 == 0x7b)) || (bVar1 == 0x7d)) {
      return true;
    }
    this->filePtr = (char *)(pbVar2 + 1);
    pbVar2 = pbVar2 + 1;
  }
  return false;
}

Assistant:

bool Parser::SkipToNextToken()
{
    while (true)
    {
        char me = *filePtr;

        // increase the line number counter if necessary
        if (IsLineEnd(me) && !bLastWasEndLine)
        {
            ++iLineNumber;
            bLastWasEndLine = true;
        }
        else bLastWasEndLine = false;
        if ('*' == me || '}' == me || '{' == me)return true;
        if ('\0' == me)return false;

        ++filePtr;
    }
}